

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

bool_t hexEqRev(void *buf,char *hex)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long in_RSI;
  byte *in_RDI;
  size_t count;
  word diff;
  size_t local_20;
  char *local_10;
  byte *local_8;
  
  bVar3 = 0;
  local_20 = strLen((char *)0x116451);
  local_10 = (char *)(in_RSI + local_20);
  local_8 = in_RDI;
  for (; local_20 != 0; local_20 = local_20 - 2) {
    bVar1 = *local_8;
    local_10 = local_10 + -2;
    bVar2 = hexToO(local_10);
    bVar3 = bVar1 ^ bVar2 | bVar3;
    local_8 = local_8 + 1;
  }
  return (bool_t)(bVar3 == 0);
}

Assistant:

bool_t SAFE(hexEqRev)(const void* buf, const char* hex)
{
	register word diff = 0;
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	hex = hex + count;
	for (; count; count -= 2, buf = (const octet*)buf + 1)
		diff |= *(const octet*)buf ^ hexToO(hex -= 2);
	return wordEq(diff, 0);
}